

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseDefaultDecl(xmlParserCtxtPtr ctxt,xmlChar **value)

{
  xmlChar xVar1;
  xmlParserInputPtr in;
  int iVar2;
  xmlChar *pxVar3;
  int iVar4;
  
  *value = (xmlChar *)0x0;
  in = ctxt->input;
  pxVar3 = in->cur;
  iVar4 = 1;
  if (*pxVar3 == '#') {
    xVar1 = pxVar3[1];
    if (xVar1 == 'F') {
      if (((pxVar3[2] == 'I') && (pxVar3[3] == 'X')) && ((pxVar3[4] == 'E' && (pxVar3[5] == 'D'))))
      {
        in->cur = pxVar3 + 6;
        in->col = in->col + 6;
        if (pxVar3[6] == '\0') {
          xmlParserInputGrow(in,0xfa);
        }
        iVar2 = xmlSkipBlankChars(ctxt);
        iVar4 = 4;
        if (iVar2 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'#FIXED\'\n");
        }
      }
    }
    else if (xVar1 == 'I') {
      if (((((pxVar3[2] == 'M') && (pxVar3[3] == 'P')) && (pxVar3[4] == 'L')) &&
          ((pxVar3[5] == 'I' && (pxVar3[6] == 'E')))) && (pxVar3[7] == 'D')) {
        in->cur = pxVar3 + 8;
        in->col = in->col + 8;
        iVar4 = 3;
        xVar1 = pxVar3[8];
        goto joined_r0x0015a81b;
      }
    }
    else if ((((xVar1 == 'R') && (pxVar3[2] == 'E')) &&
             ((pxVar3[3] == 'Q' &&
              (((pxVar3[4] == 'U' && (pxVar3[5] == 'I')) && (pxVar3[6] == 'R')))))) &&
            ((pxVar3[7] == 'E' && (pxVar3[8] == 'D')))) {
      in->cur = pxVar3 + 9;
      in->col = in->col + 9;
      iVar4 = 2;
      xVar1 = pxVar3[9];
joined_r0x0015a81b:
      if (xVar1 != '\0') {
        return iVar4;
      }
      xmlParserInputGrow(in,0xfa);
      return iVar4;
    }
  }
  pxVar3 = xmlParseAttValue(ctxt);
  ctxt->instate = XML_PARSER_DTD;
  if (pxVar3 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,ctxt->errNo,"Attribute default value declaration error\n");
  }
  else {
    *value = pxVar3;
  }
  return iVar4;
}

Assistant:

int
xmlParseDefaultDecl(xmlParserCtxtPtr ctxt, xmlChar **value) {
    int val;
    xmlChar *ret;

    *value = NULL;
    if (CMP9(CUR_PTR, '#', 'R', 'E', 'Q', 'U', 'I', 'R', 'E', 'D')) {
	SKIP(9);
	return(XML_ATTRIBUTE_REQUIRED);
    }
    if (CMP8(CUR_PTR, '#', 'I', 'M', 'P', 'L', 'I', 'E', 'D')) {
	SKIP(8);
	return(XML_ATTRIBUTE_IMPLIED);
    }
    val = XML_ATTRIBUTE_NONE;
    if (CMP6(CUR_PTR, '#', 'F', 'I', 'X', 'E', 'D')) {
	SKIP(6);
	val = XML_ATTRIBUTE_FIXED;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '#FIXED'\n");
	}
    }
    ret = xmlParseAttValue(ctxt);
    ctxt->instate = XML_PARSER_DTD;
    if (ret == NULL) {
	xmlFatalErrMsg(ctxt, (xmlParserErrors)ctxt->errNo,
		       "Attribute default value declaration error\n");
    } else
        *value = ret;
    return(val);
}